

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O3

bool __thiscall Nibbler::getUnsignedInt(Nibbler *this,int *result)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  intmax_t iVar4;
  ulong uVar5;
  ulong uVar6;
  long *local_40 [2];
  long local_30 [2];
  
  uVar1 = this->_length;
  uVar2 = this->_cursor;
  if (uVar1 <= uVar2) {
    return false;
  }
  uVar5 = uVar2;
  do {
    uVar6 = uVar5;
    if (9 < (int)(this->_input)._M_dataplus._M_p[uVar5] - 0x30U) break;
    uVar5 = uVar5 + 1;
    uVar6 = uVar1;
  } while (uVar1 != uVar5);
  if (uVar2 < uVar6) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)this);
    iVar4 = strtoimax((char *)local_40[0],(char **)0x0,10);
    *result = (int)iVar4;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    this->_cursor = uVar6;
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Nibbler::getUnsignedInt (int& result)
{
  std::string::size_type i = _cursor;
  // TODO Potential for use of find_first_not_of
  while (i < _length && isdigit (_input[i]))
    ++i;

  if (i > _cursor)
  {
    result = strtoimax (_input.substr (_cursor, i - _cursor).c_str (), NULL, 10);
    _cursor = i;
    return true;
  }

  return false;
}